

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_help.cpp
# Opt level: O0

void __thiscall
Help_BuildDefaultCategoryOnly_Test::TestBody(Help_BuildDefaultCategoryOnly_Test *this)

{
  allocator<pstore::command_line::option_*> *this_00;
  initializer_list<pstore::command_line::option_*> __l;
  bool bVar1;
  char *pcVar2;
  reference lhs;
  _Head_base<0UL,_pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*,_false>
  in_stack_fffffffffffffd00;
  AssertHelper local_2c8;
  Message local_2c0;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  *local_2b8;
  testing local_2b0 [8];
  char local_2a8 [8];
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_2;
  Message local_288;
  void *local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_1;
  pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>
  *first;
  AssertHelper local_250;
  Message local_248;
  uint local_23c;
  size_type local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar;
  categories_collection actual;
  option *local_1e8;
  undefined1 *local_1e0;
  iterator local_1d8;
  size_type local_1d0;
  undefined1 local_1c8 [8];
  options_container container;
  undefined1 local_1a0 [8];
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  option2;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  option1;
  Help_BuildDefaultCategoryOnly_Test *this_local;
  
  pstore::command_line::
  opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>::
  opt<char[5],pstore::command_line::details::positional>
            ((opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>> *)
             ((long)&option2.parser_.super_parser_base.literals_.
                     super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
                     ._M_impl.super__Vector_impl_data + 0x10),(char (*) [5])"arg1",
             (positional *)&pstore::command_line::positional);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::opt<char[5]>((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                  *)local_1a0,(char (*) [5])"arg2");
  local_1e8 = (option *)
              ((long)&option2.parser_.super_parser_base.literals_.
                      super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
                      ._M_impl.super__Vector_impl_data + 0x10);
  local_1e0 = local_1a0;
  local_1d8 = &local_1e8;
  local_1d0 = 2;
  this_00 = (allocator<pstore::command_line::option_*> *)
            ((long)&actual._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
  std::allocator<pstore::command_line::option_*>::allocator(this_00);
  __l._M_len = local_1d0;
  __l._M_array = local_1d8;
  std::__cxx11::
  list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::list
            ((list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
              *)local_1c8,__l,this_00);
  std::allocator<pstore::command_line::option_*>::~allocator
            ((allocator<pstore::command_line::option_*> *)
             ((long)&actual._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  pstore::command_line::details::build_categories
            ((categories_collection *)&gtest_ar.message_,(option *)0x0,
             (options_container *)local_1c8);
  local_238 = std::
              map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
              ::size((map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
                      *)&gtest_ar.message_);
  local_23c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_230,"actual.size ()","1U",&local_238,&local_23c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  if (bVar1) {
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::
           map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
           ::begin((map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
                    *)&gtest_ar.message_);
    lhs = std::
          _Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
          ::operator*((_Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
                       *)&gtest_ar_1.message_);
    local_280 = (void *)0x0;
    testing::internal::EqHelper::
    Compare<const_pstore::command_line::option_category_*,_std::nullptr_t,_nullptr>
              ((EqHelper *)local_278,"first.first","nullptr",&lhs->first,&local_280);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
    if (!bVar1) {
      testing::Message::Message(&local_288);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
                 ,0x51,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_288);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_288);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
    local_2b8 = (opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                 *)local_1a0;
    testing::
    ElementsAre<pstore::command_line::opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>*>
              (local_2b0,&local_2b8);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<pstore::command_line::opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>*>>>
              ((ElementsAreMatcher<std::tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>_>
                )in_stack_fffffffffffffd00._M_head_impl);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<pstore::command_line::opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>*>>>
    ::operator()(local_2a0,local_2a8,
                 (set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>
                  *)"first.second");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
    if (!bVar1) {
      testing::Message::Message(&local_2c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
      testing::internal::AssertHelper::AssertHelper
                (&local_2c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
                 ,0x52,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
      testing::internal::AssertHelper::~AssertHelper(&local_2c8);
      testing::Message::~Message(&local_2c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  }
  std::
  map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
  ::~map((map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
          *)&gtest_ar.message_);
  std::__cxx11::
  list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::~list
            ((list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
              *)local_1c8);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
          *)local_1a0);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
          *)((long)&option2.parser_.super_parser_base.literals_.
                    super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
                    ._M_impl.super__Vector_impl_data + 0x10));
  return;
}

Assistant:

TEST_F (Help, BuildDefaultCategoryOnly) {
    {
        opt<std::string> option1{"arg1", positional};
        opt<std::string> option2{"arg2"};
        option::options_container container{&option1, &option2};
        details::categories_collection const actual =
            details::build_categories (nullptr, container);

        ASSERT_EQ (actual.size (), 1U);
        auto const & first = *actual.begin ();
        EXPECT_EQ (first.first, nullptr);
        EXPECT_THAT (first.second, testing::ElementsAre (&option2));
    }
}